

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spookyv2.cpp
# Opt level: O0

void __thiscall SpookyHash::Update(SpookyHash *this,void *message,size_t length)

{
  byte bVar1;
  ulong uVar2;
  uint64 *__src;
  uint8 prefix;
  uint64 *end;
  anon_union_8_3_837c87a1 u;
  uint8 remainder;
  size_t newLength;
  uint64 h11;
  uint64 h10;
  uint64 h9;
  uint64 h8;
  uint64 h7;
  uint64 h6;
  uint64 h5;
  uint64 h4;
  uint64 h3;
  uint64 h2;
  uint64 h1;
  uint64 h0;
  size_t length_local;
  void *message_local;
  SpookyHash *this_local;
  
  uVar2 = length + this->m_remainder;
  h0 = length;
  length_local = (size_t)message;
  message_local = this;
  if (uVar2 < 0xc0) {
    memcpy((void *)((long)this->m_data + (ulong)this->m_remainder),message,length);
    this->m_length = h0 + this->m_length;
    this->m_remainder = (uint8)uVar2;
  }
  else {
    if (this->m_length < 0xc0) {
      h10 = this->m_state[0];
      h11 = this->m_state[1];
      newLength = 0xdeadbeefdeadbeef;
      h9 = 0xdeadbeefdeadbeef;
      h6 = 0xdeadbeefdeadbeef;
      h3 = 0xdeadbeefdeadbeef;
      h8 = h11;
      h7 = h10;
      h5 = h11;
      h4 = h10;
      h2 = h11;
      h1 = h10;
    }
    else {
      h1 = this->m_state[0];
      h2 = this->m_state[1];
      h3 = this->m_state[2];
      h4 = this->m_state[3];
      h5 = this->m_state[4];
      h6 = this->m_state[5];
      h7 = this->m_state[6];
      h8 = this->m_state[7];
      h9 = this->m_state[8];
      h10 = this->m_state[9];
      h11 = this->m_state[10];
      newLength = this->m_state[0xb];
    }
    this->m_length = length + this->m_length;
    end = (uint64 *)message;
    if (this->m_remainder != '\0') {
      bVar1 = -this->m_remainder - 0x40;
      memcpy((void *)((long)this->m_data + (ulong)this->m_remainder),message,(ulong)bVar1);
      Mix(this->m_data,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11,&newLength);
      Mix(this->m_data + 0xc,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11,&newLength);
      end = (uint64 *)(length_local + (long)(int)(uint)bVar1);
      h0 = h0 - bVar1;
    }
    __src = end + (h0 / 0x60) * 0xc;
    bVar1 = (char)h0 - ((char)__src - (char)end);
    for (; end < __src; end = end + 0xc) {
      Mix(end,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11,&newLength);
    }
    this->m_remainder = bVar1;
    memcpy(this,__src,(ulong)bVar1);
    this->m_state[0] = h1;
    this->m_state[1] = h2;
    this->m_state[2] = h3;
    this->m_state[3] = h4;
    this->m_state[4] = h5;
    this->m_state[5] = h6;
    this->m_state[6] = h7;
    this->m_state[7] = h8;
    this->m_state[8] = h9;
    this->m_state[9] = h10;
    this->m_state[10] = h11;
    this->m_state[0xb] = newLength;
  }
  return;
}

Assistant:

void SpookyHash::Update(const void *message, size_t length)
{
    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    size_t newLength = length + m_remainder;
    uint8  remainder;
    union
    {
        const uint8 *p8;
        uint64 *p64;
        size_t i;
    } u;
    const uint64 *end;

    // Is this message fragment too short?  If it is, stuff it away.
    if (newLength < sc_bufSize)
    {
        memcpy(&((uint8 *)m_data)[m_remainder], message, length);
        m_length = length + m_length;
        m_remainder = (uint8)newLength;
        return;
    }

    // init the variables
    if (m_length < sc_bufSize)
    {
        h0=h3=h6=h9  = m_state[0];
        h1=h4=h7=h10 = m_state[1];
        h2=h5=h8=h11 = sc_const;
    }
    else
    {
        h0 = m_state[0];
        h1 = m_state[1];
        h2 = m_state[2];
        h3 = m_state[3];
        h4 = m_state[4];
        h5 = m_state[5];
        h6 = m_state[6];
        h7 = m_state[7];
        h8 = m_state[8];
        h9 = m_state[9];
        h10 = m_state[10];
        h11 = m_state[11];
    }
    m_length = length + m_length;

    // if we've got anything stuffed away, use it now
    if (m_remainder)
    {
        uint8 prefix = sc_bufSize-m_remainder;
        memcpy(&(((uint8 *)m_data)[m_remainder]), message, prefix);
        u.p64 = m_data;
        Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        Mix(&u.p64[sc_numVars], h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p8 = ((const uint8 *)message) + prefix;
        length -= prefix;
    }
    else
    {
        u.p8 = (const uint8 *)message;
    }

    // handle all whole blocks of sc_blockSize bytes
    end = u.p64 + (length/sc_blockSize)*sc_numVars;
    remainder = (uint8)(length-((const uint8 *)end-u.p8));
    if (ALLOW_UNALIGNED_READS || (u.i & 0x7) == 0)
    {
        while (u.p64 < end)
        {
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        {
            memcpy(m_data, u.p8, sc_blockSize);
            Mix(m_data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p64 += sc_numVars;
        }
    }

    // stuff away the last few bytes
    m_remainder = remainder;
    memcpy(m_data, end, remainder);

    // stuff away the variables
    m_state[0] = h0;
    m_state[1] = h1;
    m_state[2] = h2;
    m_state[3] = h3;
    m_state[4] = h4;
    m_state[5] = h5;
    m_state[6] = h6;
    m_state[7] = h7;
    m_state[8] = h8;
    m_state[9] = h9;
    m_state[10] = h10;
    m_state[11] = h11;
}